

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_seek(stb_vorbis *f,uint sample_number)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  uint in_ESI;
  int *in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32 frame_start;
  int n;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar3 = stb_vorbis_seek_frame
                    ((stb_vorbis *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint)((ulong)in_RDI >> 0x20));
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    if (in_ESI != in_RDI[0x160]) {
      uVar1 = in_RDI[0x160];
      stb_vorbis_get_frame_float
                ((stb_vorbis *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (float ***)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      do {
        if (uVar1 < in_ESI) goto LAB_00137fa7;
        iVar3 = SDL_ReportAssertion(&stb_vorbis_seek::sdl_assert_data,"stb_vorbis_seek",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                    ,0x1335);
      } while (iVar3 == 0);
      if (iVar3 == 1) {
        pcVar2 = (code *)swi(3);
        iVar3 = (*pcVar2)();
        return iVar3;
      }
LAB_00137fa7:
      do {
        if ((int)(in_RDI[0x1c5] + (in_ESI - uVar1)) <= in_RDI[0x1c6]) goto LAB_0013800a;
        iVar3 = SDL_ReportAssertion(&stb_vorbis_seek::sdl_assert_data_1,"stb_vorbis_seek",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                    ,0x1336);
      } while (iVar3 == 0);
      if (iVar3 == 1) {
        pcVar2 = (code *)swi(3);
        iVar3 = (*pcVar2)();
        return iVar3;
      }
LAB_0013800a:
      in_RDI[0x1c5] = (in_ESI - uVar1) + in_RDI[0x1c5];
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int stb_vorbis_seek(stb_vorbis *f, unsigned int sample_number)
{
   if (!stb_vorbis_seek_frame(f, sample_number))
      return 0;

   if (sample_number != f->current_loc) {
      int n;
      uint32 frame_start = f->current_loc;
      stb_vorbis_get_frame_float(f, &n, NULL);
      assert(sample_number > frame_start);
      assert(f->channel_buffer_start + (int) (sample_number-frame_start) <= f->channel_buffer_end);
      f->channel_buffer_start += (sample_number - frame_start);
   }

   return 1;
}